

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_functions.cpp
# Opt level: O2

void duckdb::ArrayCrossProductFun::GetFunctions(void)

{
  BaseScalarFunction *pBVar1;
  long in_RDI;
  long lVar2;
  ScalarFunction *func;
  BaseScalarFunction *function;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  allocator_type local_479;
  allocator local_478 [24];
  LogicalType local_460 [24];
  LogicalType double_array;
  LogicalType float_array;
  _Function_base local_418;
  code *local_400;
  _Function_base local_3f8;
  code *local_3e0;
  LogicalType local_3d8 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_3c0;
  LogicalType local_3a8 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_390;
  LogicalType local_378 [24];
  LogicalType local_360 [24];
  string local_348 [32];
  ScalarFunction local_328;
  ScalarFunction local_200;
  BaseScalarFunction local_d8 [176];
  
  std::__cxx11::string::string(local_348,"array_cross_product",local_478);
  duckdb::ScalarFunctionSet::ScalarFunctionSet();
  std::__cxx11::string::~string(local_348);
  duckdb::LogicalType::LogicalType((LogicalType *)local_478,FLOAT);
  duckdb::LogicalType::ARRAY(&float_array,(optional_idx)local_478);
  duckdb::LogicalType::~LogicalType((LogicalType *)local_478);
  duckdb::LogicalType::LogicalType((LogicalType *)local_478,DOUBLE);
  duckdb::LogicalType::ARRAY(&double_array,(optional_idx)local_478);
  duckdb::LogicalType::~LogicalType((LogicalType *)local_478);
  duckdb::LogicalType::LogicalType((LogicalType *)local_478,&float_array);
  duckdb::LogicalType::LogicalType(local_460,&float_array);
  __l._M_len = 2;
  __l._M_array = (iterator)local_478;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_390,__l,&local_479);
  duckdb::LogicalType::LogicalType(local_3a8,&float_array);
  local_3f8._M_functor._8_8_ = 0;
  local_3f8._M_functor._M_unused._M_object = ArrayFixedCombine<float,duckdb::CrossProductOp,3ul>;
  local_3e0 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_3f8._M_manager =
       std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  duckdb::LogicalType::LogicalType(local_360,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&local_200,&local_390,local_3a8,&local_3f8,0,0,0,0,local_360,0,0,0);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            ((vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *)
             (in_RDI + 0x20),&local_200);
  ScalarFunction::~ScalarFunction(&local_200);
  duckdb::LogicalType::~LogicalType(local_360);
  std::_Function_base::~_Function_base(&local_3f8);
  duckdb::LogicalType::~LogicalType(local_3a8);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_390);
  lVar2 = 0x18;
  do {
    duckdb::LogicalType::~LogicalType((LogicalType *)(local_478 + lVar2));
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  duckdb::LogicalType::LogicalType((LogicalType *)local_478,&double_array);
  duckdb::LogicalType::LogicalType(local_460,&double_array);
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)local_478;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_3c0,__l_00,&local_479);
  duckdb::LogicalType::LogicalType(local_3d8,&double_array);
  local_418._M_functor._8_8_ = 0;
  local_418._M_functor._M_unused._M_object = ArrayFixedCombine<double,duckdb::CrossProductOp,3ul>;
  local_400 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_418._M_manager =
       std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  duckdb::LogicalType::LogicalType(local_378,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&local_328,&local_3c0,local_3d8,&local_418,0,0,0,0,local_378,0,0,0);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            ((vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *)
             (in_RDI + 0x20),&local_328);
  ScalarFunction::~ScalarFunction(&local_328);
  duckdb::LogicalType::~LogicalType(local_378);
  std::_Function_base::~_Function_base(&local_418);
  duckdb::LogicalType::~LogicalType(local_3d8);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_3c0);
  lVar2 = 0x18;
  do {
    duckdb::LogicalType::~LogicalType((LogicalType *)(local_478 + lVar2));
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  pBVar1 = *(BaseScalarFunction **)(in_RDI + 0x28);
  for (function = *(BaseScalarFunction **)(in_RDI + 0x20); function != pBVar1;
      function = function + 0x128) {
    BaseScalarFunction::SetReturnsError(local_d8,function);
    duckdb::BaseScalarFunction::~BaseScalarFunction(local_d8);
  }
  duckdb::LogicalType::~LogicalType(&double_array);
  duckdb::LogicalType::~LogicalType(&float_array);
  return;
}

Assistant:

ScalarFunctionSet ArrayCrossProductFun::GetFunctions() {
	ScalarFunctionSet set("array_cross_product");

	auto float_array = LogicalType::ARRAY(LogicalType::FLOAT, 3);
	auto double_array = LogicalType::ARRAY(LogicalType::DOUBLE, 3);
	set.AddFunction(
	    ScalarFunction({float_array, float_array}, float_array, ArrayFixedCombine<float, CrossProductOp, 3>));
	set.AddFunction(
	    ScalarFunction({double_array, double_array}, double_array, ArrayFixedCombine<double, CrossProductOp, 3>));
	for (auto &func : set.functions) {
		BaseScalarFunction::SetReturnsError(func);
	}
	return set;
}